

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool doctest::anon_unknown_14::parseCommaSepArgs
               (int argc,char **argv,char *pattern,
               vector<doctest::String,_std::allocator<doctest::String>_> *res)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 extraout_AL;
  char *extraout_RAX;
  char *__s;
  size_t sVar3;
  anon_union_24_2_13149d16_for_String_2 *value;
  String filtersString;
  anon_union_24_2_13149d16_for_String_2 local_58;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  value = &local_40;
  local_40.buf[0] = '\0';
  local_40.buf[0x17] = '\x17';
  local_58.buf[0] = '\0';
  local_58.buf[0x17] = '\x17';
  bVar1 = parseOption(argc,argv,pattern,(String *)&value->data,(String *)&local_58.data);
  __s = (char *)(ulong)bVar1;
  if ((local_58.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_58._1_7_,local_58.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.buf[0]));
    __s = extraout_RAX;
  }
  if (bVar1) {
    if (local_40.buf[0x17] < '\0') {
      value = (anon_union_24_2_13149d16_for_String_2 *)CONCAT71(local_40._1_7_,local_40.buf[0]);
    }
    __s = strtok(value->buf,",");
    while (__s != (char *)0x0) {
      if (*__s != '\0') {
        sVar3 = strlen(__s);
        String::String((String *)&local_58.data,__s,(uint)sVar3);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::
        emplace_back<doctest::String>(res,(String *)&local_58.data);
        if ((local_58.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_58._1_7_,local_58.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_58._1_7_,local_58.buf[0]));
        }
      }
      __s = strtok((char *)0x0,",");
    }
  }
  uVar2 = SUB81(__s,0);
  if ((local_40.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_40._1_7_,local_40.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_40._1_7_,local_40.buf[0]));
    uVar2 = extraout_AL;
  }
  return (bool)uVar2;
}

Assistant:

bool parseCommaSepArgs(int argc, const char* const* argv, const char* pattern,
                           std::vector<String>& res) {
        String filtersString;
        if(parseOption(argc, argv, pattern, &filtersString)) {
            // tokenize with "," as a separator
            // cppcheck-suppress strtokCalled
            DOCTEST_CLANG_SUPPRESS_WARNING_WITH_PUSH("-Wdeprecated-declarations")
            auto pch = std::strtok(filtersString.c_str(), ","); // modifies the string
            while(pch != nullptr) {
                if(strlen(pch))
                    res.push_back(pch);
                // uses the strtok() internal state to go to the next token
                // cppcheck-suppress strtokCalled
                pch = std::strtok(nullptr, ",");
            }
            DOCTEST_CLANG_SUPPRESS_WARNING_POP
            return true;
        }
        return false;
    }